

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O3

void __thiscall
kainjow::mustache::
delimiter_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
delimiter_set(delimiter_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *this)

{
  (this->begin)._M_dataplus._M_p = (pointer)&(this->begin).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,delimiter_set<std::__cxx11::string>::default_begin,
             DAT_00244fb0 + delimiter_set<std::__cxx11::string>::default_begin);
  (this->end)._M_dataplus._M_p = (pointer)&(this->end).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->end,delimiter_set<std::__cxx11::string>::default_end,
             DAT_00244fd8 + delimiter_set<std::__cxx11::string>::default_end);
  return;
}

Assistant:

delimiter_set()
        : begin(default_begin)
        , end(default_end)
    {}